

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_Stop(FACTWave *pWave,uint32_t dwFlags)

{
  uint in_ESI;
  undefined8 *in_RDI;
  FACTNotification note;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  FAudioSourceVoice *in_stack_ffffffffffffffc8;
  FAudioSourceVoice *in_stack_ffffffffffffffd0;
  uint32_t local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x1161c9);
    if (((in_ESI & 1) == 0) && ((*(uint *)(in_RDI + 4) & 0x40) == 0)) {
      *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) | 0x10;
      FAudioSourceVoice_ExitLoop
                ((FAudioSourceVoice *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 0);
    }
    else {
      *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) | 0x20;
      *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) & 0xffffffa7;
      FAudioSourceVoice_Stop
                (in_stack_ffffffffffffffc8,(uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffffc0);
      FAudioSourceVoice_FlushSourceBuffers(in_stack_ffffffffffffffd0);
    }
    if ((*(uint *)(*(long *)*in_RDI + 0xe0) & 0x2000) != 0) {
      (**(code **)(*(long *)*in_RDI + 8))(&stack0xffffffffffffffbb);
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1162c7);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWave_Stop(FACTWave *pWave, uint32_t dwFlags)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	/* There are two ways that a Wave might be stopped immediately:
	 * 1. The program explicitly asks for it
	 * 2. The Wave is paused and therefore we can't do fade/release effects
	 */
	if (	dwFlags & FACT_FLAG_STOP_IMMEDIATE ||
		pWave->state & FACT_STATE_PAUSED	)
	{
		pWave->state |= FACT_STATE_STOPPED;
		pWave->state &= ~(
			FACT_STATE_PLAYING |
			FACT_STATE_STOPPING |
			FACT_STATE_PAUSED
		);
		FAudioSourceVoice_Stop(pWave->voice, 0, 0);
		FAudioSourceVoice_FlushSourceBuffers(pWave->voice);
	}
	else
	{
		pWave->state |= FACT_STATE_STOPPING;
		FAudioSourceVoice_ExitLoop(pWave->voice, 0);
	}

	if (pWave->parentBank->parentEngine->notifications & NOTIFY_WAVESTOP)
	{
		FACTNotification note;
		note.type = FACTNOTIFICATIONTYPE_WAVESTOP;
		note.wave.pWave = pWave;
		if (pWave->parentBank->parentEngine->notifications & NOTIFY_WAVESTOP)
		{
			note.pvContext = pWave->parentBank->parentEngine->wave_context;
		}
		pWave->parentBank->parentEngine->notificationCallback(&note);
	}

	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}